

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::anon_unknown_1::SyncObjectResetCase::passAndLog
          (SyncObjectResetCase *this,
          SharedPtr<deqp::egl::(anonymous_namespace)::ContextReset> *contextReset)

{
  ostringstream *this_00;
  int iVar1;
  char *description;
  TestContext *this_01;
  bool bVar2;
  Enum<int,_2UL> local_1c0;
  Enum<int,_2UL> local_1b0;
  MessageBuilder local_1a0;
  
  (*contextReset->m_ptr->m_gl->getSynciv)
            (contextReset->m_ptr->m_sync,0x9114,4,(GLsizei *)0x0,(GLint *)&local_1a0);
  iVar1 = (int)local_1a0.m_log;
  bVar2 = (int)local_1a0.m_log != 0x9119;
  if (bVar2) {
    local_1a0.m_log =
         ((this->super_ContextResetCase).super_RobustnessTestCase.super_TestCase.super_TestCase.
          super_TestNode.m_testCtx)->m_log;
    this_00 = &local_1a0.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
    std::operator<<((ostream *)this_00,"Test failed! glGetSynciv() returned wrong value [");
    local_1b0.m_getName = glu::getErrorName;
    local_1b0.m_value = iVar1;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1b0,(ostream *)this_00);
    std::operator<<((ostream *)this_00,", expected ");
    local_1c0.m_getName = glu::getErrorName;
    local_1c0.m_value = 0x9119;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)this_00);
    std::operator<<((ostream *)this_00,"]");
    tcu::MessageBuilder::operator<<(&local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
    this_01 = (this->super_ContextResetCase).super_RobustnessTestCase.super_TestCase.super_TestCase.
              super_TestNode.m_testCtx;
    description = "Fail";
  }
  else {
    this_01 = (this->super_ContextResetCase).super_RobustnessTestCase.super_TestCase.super_TestCase.
              super_TestNode.m_testCtx;
    description = "Pass";
  }
  tcu::TestContext::setTestResult(this_01,(uint)bVar2,description);
  return;
}

Assistant:

virtual void passAndLog (de::SharedPtr<ContextReset>& contextReset)
	{
		const glw::GLint status = contextReset->getSyncStatus();
		if (status != GL_SIGNALED)
		{
			m_testCtx.getLog()	<< tcu::TestLog::Message
								<< "Test failed! glGetSynciv() returned wrong value [" << glu::getErrorStr(status) << ", expected " << glu::getErrorStr(GL_SIGNALED) << "]"
								<< tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}